

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O2

void __thiscall
chrono::turtlebot::Turtlebot_Chassis::Turtlebot_Chassis
          (Turtlebot_Chassis *this,string *name,bool fixed,
          shared_ptr<chrono::ChMaterialSurface> *mat,ChSystem *system,ChVector<double> *body_pos,
          ChQuaternion<double> *body_rot,bool collide)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  shared_ptr<chrono::ChBodyAuxRef> local_58;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  local_58.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Turtlebot_Part::Turtlebot_Part
            (&this->super_Turtlebot_Part,name,fixed,
             (shared_ptr<chrono::ChMaterialSurface> *)&local_40,system,body_pos,body_rot,&local_58,
             collide);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_Turtlebot_Part)._vptr_Turtlebot_Part = (_func_int **)&PTR__Turtlebot_Part_001a1418;
  std::__cxx11::string::assign((char *)&(this->super_Turtlebot_Part).m_mesh_name);
  auVar2._8_4_ = 0x3ecccccd;
  auVar2._0_8_ = 0x3ecccccd3ecccccd;
  auVar2._12_4_ = 0x3ecccccd;
  (this->super_Turtlebot_Part).m_offset.m_data[2] = 0.0;
  (this->super_Turtlebot_Part).m_offset.m_data[0] = 0.0;
  (this->super_Turtlebot_Part).m_offset.m_data[1] = 0.0;
  uVar1 = vmovlps_avx(auVar2);
  (this->super_Turtlebot_Part).m_color.R = (float)(int)uVar1;
  (this->super_Turtlebot_Part).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_Turtlebot_Part).m_color.B = 0.7;
  (this->super_Turtlebot_Part).m_density = 100.0;
  return;
}

Assistant:

Turtlebot_Chassis::Turtlebot_Chassis(const std::string& name,
                                     bool fixed,
                                     std::shared_ptr<ChMaterialSurface> mat,
                                     ChSystem* system,
                                     const ChVector<>& body_pos,
                                     const ChQuaternion<>& body_rot,
                                     bool collide)
    : Turtlebot_Part(name, fixed, mat, system, body_pos, body_rot, NULL, collide) {
    m_mesh_name = "chassis";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.4f, 0.4f, 0.7f);
    m_density = 100;
}